

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  
  vVar1 = FadBinaryMul<Fad<double>,_Fad<double>_>::fastAccessDx(&this->left_->fadexpr_,i);
  dVar2 = cos(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  vVar3 = FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>::fastAccessDx
                    (&this->right_->fadexpr_,i);
  return vVar3 * ((this->left_->fadexpr_).left_)->val_ * ((this->left_->fadexpr_).right_)->val_ +
         dVar2 * vVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}